

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSOSRWHandler * find_rh(JSThreadState *ts,int fd)

{
  JSThreadState *pJVar1;
  
  pJVar1 = ts;
  do {
    pJVar1 = (JSThreadState *)(pJVar1->os_rw_handlers).next;
    if (pJVar1 == ts) {
      return (JSOSRWHandler *)0x0;
    }
  } while (*(int *)&(pJVar1->os_signal_handlers).prev != fd);
  return (JSOSRWHandler *)pJVar1;
}

Assistant:

static JSOSRWHandler *find_rh(JSThreadState *ts, int fd)
{
    JSOSRWHandler *rh;
    struct list_head *el;

    list_for_each(el, &ts->os_rw_handlers) {
        rh = list_entry(el, JSOSRWHandler, link);
        if (rh->fd == fd)
            return rh;
    }
    return NULL;
}